

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_wrapper_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::csharp::WrapperFieldGenerator::GenerateMergingCode
          (WrapperFieldGenerator *this,Printer *printer)

{
  char *in_stack_000001d0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_000001d8;
  Printer *in_stack_000001e0;
  
  io::Printer::Print(in_stack_000001e0,in_stack_000001d8,in_stack_000001d0);
  return;
}

Assistant:

void WrapperFieldGenerator::GenerateMergingCode(io::Printer* printer) {
  printer->Print(
    variables_,
    "if (other.$has_property_check$) {\n"
    "  if ($has_not_property_check$ || other.$property_name$ != $default_value$) {\n"
    "    $property_name$ = other.$property_name$;\n"
    "  }\n"
    "}\n");
}